

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arbitrary.cpp
# Opt level: O3

bool __thiscall
ArbitraryArbitrary_Arithmetic_IntCast::Run(ArbitraryArbitrary_Arithmetic_IntCast *this)

{
  testinator::detail::Arbitrary_Arithmetic_IntCast<signed_char>::generate(3,0);
  return true;
}

Assistant:

DEF_TEST(Arbitrary_Arithmetic_IntCast, Arbitrary)
{
  testinator::Arbitrary<signed char> a;
  signed char v = a.generate(0,0);
  v = a.generate(1,0);
  v = a.generate(2,0);
  v = a.generate(3,0);
  a.shrink(v);
  return true;
}